

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void do_undo_last_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  Am_Value *value;
  Am_Object undo_handler;
  Am_Object_Method undoit;
  Am_Object AStack_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  Am_Object::Am_Object(&local_30,cmd);
  get_undo_handler(&local_38);
  Am_Object::~Am_Object(&local_30);
  local_28.from_wrapper = (Am_Method_Wrapper *)0x0;
  local_28.Call = (Am_Object_Method_Type *)0x0;
  value = Am_Object::Get(&local_38,0x176,0);
  Am_Object_Method::operator=(&local_28,value);
  pAVar1 = local_28.Call;
  Am_Object::Am_Object(&local_40,&local_38);
  (*pAVar1)((Am_Object_Data *)&local_40);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&AStack_48,cmd);
  mark_changed_command_to_undo(&AStack_48);
  Am_Object::~Am_Object(&AStack_48);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_undo_last, (Am_Object cmd))
{
  Am_Object undo_handler = get_undo_handler(cmd);
  Am_Object_Method undoit;
  undoit = undo_handler.Get(Am_PERFORM_UNDO);
  undoit.Call(undo_handler);
  mark_changed_command_to_undo(cmd);
}